

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlwriter.c
# Opt level: O3

xmlChar * xmlTextWriterVSprintf(char *format,__va_list_tag *argptr)

{
  size_t sVar1;
  uint uVar2;
  xmlChar *__s;
  size_t __maxlen;
  va_list locarg;
  undefined8 local_48;
  void *pvStack_40;
  void *local_38;
  
  __s = (xmlChar *)(*xmlMalloc)(0x2000);
  if (__s == (xmlChar *)0x0) {
LAB_001b6a34:
    __s = (xmlChar *)0x0;
    xmlRaiseError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,(void *)0x0,
                  (xmlNode *)0x0,0x19,2,XML_ERR_FATAL,(char *)0x0,0,(char *)0x0,(char *)0x0,
                  (char *)0x0,0,0,"%s","xmlTextWriterVSprintf : out of memory!\n");
  }
  else {
    local_38 = argptr->reg_save_area;
    local_48._0_4_ = argptr->gp_offset;
    local_48._4_4_ = argptr->fp_offset;
    pvStack_40 = argptr->overflow_arg_area;
    uVar2 = vsnprintf((char *)__s,0x2000,format,&local_48);
    if (0x1ffe < uVar2) {
      sVar1 = 0x4000;
      do {
        __maxlen = sVar1;
        (*xmlFree)(__s);
        __s = (xmlChar *)(*xmlMalloc)(__maxlen);
        if (__s == (xmlChar *)0x0) goto LAB_001b6a34;
        local_38 = argptr->reg_save_area;
        local_48._0_4_ = argptr->gp_offset;
        local_48._4_4_ = argptr->fp_offset;
        pvStack_40 = argptr->overflow_arg_area;
        uVar2 = vsnprintf((char *)__s,__maxlen,format,&local_48);
        sVar1 = __maxlen + 0x2000;
      } while ((((int)__maxlen <= (int)uVar2) || ((int)uVar2 < 0)) || (__maxlen - 1 == (ulong)uVar2)
              );
    }
  }
  return __s;
}

Assistant:

static xmlChar *
xmlTextWriterVSprintf(const char *format, va_list argptr)
{
    int size;
    int count;
    xmlChar *buf;
    va_list locarg;

    size = BUFSIZ;
    buf = (xmlChar *) xmlMalloc(size);
    if (buf == NULL) {
        xmlWriterErrMsg(NULL, XML_ERR_NO_MEMORY,
                        "xmlTextWriterVSprintf : out of memory!\n");
        return NULL;
    }

    va_copy(locarg, argptr);
    while (((count = vsnprintf((char *) buf, size, format, locarg)) < 0)
           || (count == size - 1) || (count == size) || (count > size)) {
	va_end(locarg);
        xmlFree(buf);
        size += BUFSIZ;
        buf = (xmlChar *) xmlMalloc(size);
        if (buf == NULL) {
            xmlWriterErrMsg(NULL, XML_ERR_NO_MEMORY,
                            "xmlTextWriterVSprintf : out of memory!\n");
            return NULL;
        }
	va_copy(locarg, argptr);
    }
    va_end(locarg);

    return buf;
}